

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O0

int changedir(int f,int n)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *bufp;
  char bufc [1024];
  int n_local;
  int f_local;
  
  bufc._1020_4_ = n;
  strlcpy(&bufp,mgcwd,0x400);
  pcVar2 = eread("Change default directory: ",(char *)&bufp,0x400,0x3c);
  if (pcVar2 == (char *)0x0) {
    n_local = 2;
  }
  else if (*pcVar2 == '\0') {
    n_local = 0;
  }
  else {
    iVar1 = chdir((char *)&bufp);
    if (iVar1 == -1) {
      dobeep();
      ewprintf("Can\'t change dir to %s",&bufp);
      n_local = 0;
    }
    else {
      pcVar2 = getcwd(mgcwd,0x400);
      if (pcVar2 == (char *)0x0) {
        if ((char)bufp == '/') {
          strlcpy(mgcwd,&bufp,0x400);
        }
        else {
          strlcat(mgcwd,&bufp,0x400);
        }
      }
      sVar3 = strlen(mgcwd);
      if (*(char *)((long)&listbuf_ncol + sVar3 + 3) != '/') {
        strlcat(mgcwd,"/",0x400);
      }
      ewprintf("Current directory is now %s",mgcwd);
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
changedir(int f, int n)
{
	char	bufc[NFILEN], *bufp;

	(void)strlcpy(bufc, mgcwd, sizeof(bufc));
	if ((bufp = eread("Change default directory: ", bufc, NFILEN,
	    EFDEF | EFNEW | EFCR | EFFILE)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		return (FALSE);
	/* Append trailing slash */
	if (chdir(bufc) == -1) {
		dobeep();
		ewprintf("Can't change dir to %s", bufc);
		return (FALSE);
	}
	if ((bufp = getcwd(mgcwd, sizeof(mgcwd))) == NULL) {
		if (bufc[0] == '/')
			(void)strlcpy(mgcwd, bufc, sizeof(mgcwd));
		else
			(void)strlcat(mgcwd, bufc, sizeof(mgcwd));
	}
	if (mgcwd[strlen(mgcwd) - 1] != '/')
		(void)strlcat(mgcwd, "/", sizeof(mgcwd));
	ewprintf("Current directory is now %s", mgcwd);
	return (TRUE);
}